

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_asn1.cc
# Opt level: O0

int BN_marshal_asn1(CBB *cbb,BIGNUM *bn)

{
  int iVar1;
  uint uVar2;
  undefined1 local_50 [8];
  CBB child;
  BIGNUM *bn_local;
  CBB *cbb_local;
  
  child.u._24_8_ = bn;
  iVar1 = BN_is_negative(bn);
  if (iVar1 != 0) {
    ERR_put_error(3,0,0x6d,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/bn_asn1.cc"
                  ,0x29);
    return 0;
  }
  iVar1 = CBB_add_asn1(cbb,(CBB *)local_50,2);
  if ((iVar1 != 0) &&
     ((uVar2 = BN_num_bits((BIGNUM *)child.u._24_8_), (uVar2 & 7) != 0 ||
      (iVar1 = CBB_add_u8((CBB *)local_50,'\0'), iVar1 != 0)))) {
    uVar2 = BN_num_bytes((BIGNUM *)child.u._24_8_);
    iVar1 = BN_bn2cbb_padded((CBB *)local_50,(ulong)uVar2,(BIGNUM *)child.u._24_8_);
    if ((iVar1 != 0) && (iVar1 = CBB_flush(cbb), iVar1 != 0)) {
      return 1;
    }
  }
  ERR_put_error(3,0,0x76,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/bn_asn1.cc"
                ,0x34);
  return 0;
}

Assistant:

int BN_marshal_asn1(CBB *cbb, const BIGNUM *bn) {
  // Negative numbers are unsupported.
  if (BN_is_negative(bn)) {
    OPENSSL_PUT_ERROR(BN, BN_R_NEGATIVE_NUMBER);
    return 0;
  }

  CBB child;
  if (!CBB_add_asn1(cbb, &child, CBS_ASN1_INTEGER) ||
      // The number must be padded with a leading zero if the high bit would
      // otherwise be set or if |bn| is zero.
      (BN_num_bits(bn) % 8 == 0 && !CBB_add_u8(&child, 0x00)) ||
      !BN_bn2cbb_padded(&child, BN_num_bytes(bn), bn) ||
      !CBB_flush(cbb)) {
    OPENSSL_PUT_ERROR(BN, BN_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}